

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTestFailedDepsParse::Run(BuildTestFailedDepsParse *this)

{
  Builder *this_00;
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  Node *pNVar4;
  string err;
  allocator<char> local_8a;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "build bad_deps.o: cat in1\n  deps = gcc\n  depfile = in1.d\n",
              (ManifestParserOptions)0x0);
  pTVar2 = g_current_test;
  if (iVar1 == g_current_test->assertion_failures_) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"bad_deps.o",(allocator<char> *)&local_48);
    this_00 = &(this->super_BuildTest).builder_;
    pNVar4 = Builder::AddTarget(this_00,&local_88,&local_68);
    testing::Test::Check
              (pTVar2,pNVar4 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x748,"builder_.AddTarget(\"bad_deps.o\", &err)");
    std::__cxx11::string::~string((string *)&local_88);
    pTVar2 = g_current_test;
    bVar3 = std::operator==("",&local_68);
    bVar3 = testing::Test::Check
                      (pTVar2,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x749,"\"\" == err");
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"in1.d",&local_89);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"AAA BBB",&local_8a);
      VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_88,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_88);
      pTVar2 = g_current_test;
      bVar3 = Builder::Build(this_00,&local_68);
      testing::Test::Check
                (pTVar2,!bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x74f,"builder_.Build(&err)");
      pTVar2 = g_current_test;
      bVar3 = std::operator==("subcommand failed",&local_68);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x750,"\"subcommand failed\" == err");
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(BuildTest, FailedDepsParse) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build bad_deps.o: cat in1\n"
"  deps = gcc\n"
"  depfile = in1.d\n"));

  string err;
  EXPECT_TRUE(builder_.AddTarget("bad_deps.o", &err));
  ASSERT_EQ("", err);

  // These deps will fail to parse, as they should only have one
  // path to the left of the colon.
  fs_.Create("in1.d", "AAA BBB");

  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("subcommand failed", err);
}